

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O0

void __thiscall
option::PrintUsageImplementation::LineWrapper::write_one_line
          (LineWrapper *this,IStringWriter *write)

{
  bool bVar1;
  int local_1c;
  IStringWriter *pIStack_18;
  int _;
  IStringWriter *write_local;
  LineWrapper *this_local;
  
  pIStack_18 = write;
  write_local = (IStringWriter *)this;
  if ((this->wrote_something & 1U) != 0) {
    (**write->_vptr_IStringWriter)(write,"\n",1);
    local_1c = 0;
    indent(pIStack_18,&local_1c,this->x);
  }
  bVar1 = buf_empty(this);
  if (!bVar1) {
    buf_next(this);
    (**pIStack_18->_vptr_IStringWriter)
              (pIStack_18,this->datbuf[this->tail],(ulong)(uint)this->lenbuf[this->tail]);
  }
  this->wrote_something = true;
  return;
}

Assistant:

void write_one_line(IStringWriter& write)
    {
      if (wrote_something) // if we already wrote something, we need to start a new line
      {
        write("\n", 1);
        int _ = 0;
        indent(write, _, x);
      }

      if (!buf_empty())
      {
        buf_next();
        write(datbuf[tail], lenbuf[tail]);
      }

      wrote_something = true;
    }